

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

void __thiscall
Highs::formIllConditioningLp0
          (Highs *this,HighsLp *ill_conditioning_lp,vector<int,_std::allocator<int>_> *basic_var,
          bool constraint)

{
  byte bVar1;
  value_type vVar2;
  reference pvVar3;
  reference pvVar4;
  byte in_CL;
  int *in_RSI;
  long in_RDI;
  HighsInt iRow_3;
  HighsInt iRow_2;
  HighsInt iRow_1;
  HighsInt iEl;
  HighsInt iCol;
  HighsInt ill_conditioning_lp_e_row;
  HighsSparseMatrix *ill_conditioning_matrix;
  HighsSparseMatrix *incumbent_matrix;
  HighsInt iRow;
  HighsLp *incumbent_lp;
  value_type_conflict1 *in_stack_fffffffffffffea8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb0;
  value_type_conflict1 *in_stack_fffffffffffffeb8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec0;
  int local_d0;
  int local_c0;
  int local_90;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int local_68;
  int local_2c;
  
  bVar1 = in_CL & 1;
  in_RSI[1] = *(int *)(in_RDI + 0x13c) + 1;
  for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x13c); local_2c = local_2c + 1) {
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  }
  std::vector<double,_std::allocator<double>_>::push_back
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::vector<double,_std::allocator<double>_>::push_back
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  HighsSparseMatrix::ensureColwise
            ((HighsSparseMatrix *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  in_RSI[0x22] = in_RSI[1];
  for (local_68 = 0; local_68 < *(int *)(in_RDI + 0x138); local_68 = local_68 + 1) {
    pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                       ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                        (in_RDI + 0xa0),(long)local_68);
    if (*pvVar3 == kBasic) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
                 (value_type_conflict2 *)in_stack_fffffffffffffeb8);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c8),(long)local_68);
      vVar2 = *pvVar4;
      while (in_stack_ffffffffffffff84 = vVar2,
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1c8),
                                (long)(local_68 + 1)), vVar2 < *pvVar4) {
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x1f8),
                   (long)in_stack_ffffffffffffff84);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
                   (value_type_conflict2 *)in_stack_fffffffffffffeb8);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x210),
                   (long)in_stack_ffffffffffffff84);
        std::vector<double,_std::allocator<double>_>::push_back
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        vVar2 = in_stack_ffffffffffffff84 + 1;
      }
      if (bVar1 == 0) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
                   (value_type_conflict2 *)in_stack_fffffffffffffeb8);
        std::vector<double,_std::allocator<double>_>::push_back
                  (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      }
      std::vector<int,_std::allocator<int>_>::size
                ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x30));
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb0,
                 (value_type_conflict2 *)in_stack_fffffffffffffea8);
    }
  }
  for (local_90 = 0; local_90 < *(int *)(in_RDI + 0x13c); local_90 = local_90 + 1) {
    pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                       ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                        (in_RDI + 0xb8),(long)local_90);
    if (*pvVar3 == kBasic) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb0,
                 (value_type_conflict2 *)in_stack_fffffffffffffea8);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
                 (value_type_conflict2 *)in_stack_fffffffffffffeb8);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      if (bVar1 == 0) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
                   (value_type_conflict2 *)in_stack_fffffffffffffeb8);
        std::vector<double,_std::allocator<double>_>::push_back
                  (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      }
      in_stack_fffffffffffffec0 = (vector<double,_std::allocator<double>_> *)(in_RSI + 0x24);
      std::vector<int,_std::allocator<int>_>::size
                ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x30));
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb0,
                 (value_type_conflict2 *)in_stack_fffffffffffffea8);
    }
  }
  if (bVar1 != 0) {
    for (local_c0 = 0; local_c0 < *(int *)(in_RDI + 0x13c); local_c0 = local_c0 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
                 (value_type_conflict2 *)in_stack_fffffffffffffeb8);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    }
    in_stack_fffffffffffffeb8 = (value_type_conflict1 *)(in_RSI + 0x24);
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x30));
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb0,
               (value_type_conflict2 *)in_stack_fffffffffffffea8);
    in_RSI[0x22] = *(int *)(in_RDI + 0x13c);
    in_RSI[0x21] = *(int *)(in_RDI + 0x13c) + 1;
    HighsSparseMatrix::ensureRowwise
              ((HighsSparseMatrix *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    in_RSI[0x20] = 1;
  }
  for (local_d0 = 0; local_d0 < *(int *)(in_RDI + 0x13c); local_d0 = local_d0 + 1) {
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
               (value_type_conflict2 *)in_stack_fffffffffffffeb8);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    in_stack_fffffffffffffea8 = (value_type_conflict1 *)(in_RSI + 0x24);
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x30));
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb0,
               (value_type_conflict2 *)in_stack_fffffffffffffea8);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
               (value_type_conflict2 *)in_stack_fffffffffffffeb8);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    in_stack_fffffffffffffeb0 = (vector<double,_std::allocator<double>_> *)(in_RSI + 0x24);
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x30));
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb0,
               (value_type_conflict2 *)in_stack_fffffffffffffea8);
  }
  *in_RSI = *(int *)(in_RDI + 0x13c) * 3;
  in_RSI[0x21] = *in_RSI;
  in_RSI[0x22] = in_RSI[1];
  return;
}

Assistant:

void Highs::formIllConditioningLp0(HighsLp& ill_conditioning_lp,
                                   std::vector<HighsInt>& basic_var,
                                   const bool constraint) {
  HighsLp& incumbent_lp = this->model_.lp_;
  // Conditioning LP minimizes the infeasibilities of
  //
  // [B^T]y = [0]; y free - for constraint view
  // [e^T]    [1]
  //
  // [ B ]y = [0]; y free - for column view
  // [e^T]    [1]
  //
  ill_conditioning_lp.num_row_ = incumbent_lp.num_row_ + 1;
  for (HighsInt iRow = 0; iRow < incumbent_lp.num_row_; iRow++) {
    ill_conditioning_lp.row_lower_.push_back(0);
    ill_conditioning_lp.row_upper_.push_back(0);
  }
  ill_conditioning_lp.row_lower_.push_back(1);
  ill_conditioning_lp.row_upper_.push_back(1);
  HighsSparseMatrix& incumbent_matrix = incumbent_lp.a_matrix_;
  incumbent_matrix.ensureColwise();
  HighsSparseMatrix& ill_conditioning_matrix = ill_conditioning_lp.a_matrix_;
  ill_conditioning_matrix.num_row_ = ill_conditioning_lp.num_row_;
  // Form the basis matrix and
  //
  // * For constraint view, add the column e, and transpose the
  // * resulting matrix
  //
  // * For column view, add a unit entry to each column
  //
  const HighsInt ill_conditioning_lp_e_row = ill_conditioning_lp.num_row_ - 1;
  for (HighsInt iCol = 0; iCol < incumbent_lp.num_col_; iCol++) {
    if (this->basis_.col_status[iCol] != HighsBasisStatus::kBasic) continue;
    // Basic column goes into conditioning LP, possibly with unit
    // coefficient for constraint e^Ty=1
    basic_var.push_back(iCol);
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(-kHighsInf);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    for (HighsInt iEl = incumbent_matrix.start_[iCol];
         iEl < incumbent_matrix.start_[iCol + 1]; iEl++) {
      ill_conditioning_matrix.index_.push_back(incumbent_matrix.index_[iEl]);
      ill_conditioning_matrix.value_.push_back(incumbent_matrix.value_[iEl]);
    }
    if (!constraint) {
      ill_conditioning_matrix.index_.push_back(ill_conditioning_lp_e_row);
      ill_conditioning_matrix.value_.push_back(1.0);
    }
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
  }
  for (HighsInt iRow = 0; iRow < incumbent_lp.num_row_; iRow++) {
    if (this->basis_.row_status[iRow] != HighsBasisStatus::kBasic) continue;
    // Basic slack goes into conditioning LP
    basic_var.push_back(incumbent_lp.num_col_ + iRow);
    ill_conditioning_lp.col_cost_.push_back(0);
    ill_conditioning_lp.col_lower_.push_back(-kHighsInf);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    ill_conditioning_matrix.index_.push_back(iRow);
    ill_conditioning_matrix.value_.push_back(-1.0);
    if (!constraint) {
      ill_conditioning_matrix.index_.push_back(ill_conditioning_lp_e_row);
      ill_conditioning_matrix.value_.push_back(1.0);
    }
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
  }
  if (constraint) {
    // Add the column e, and transpose the resulting matrix
    for (HighsInt iRow = 0; iRow < incumbent_lp.num_row_; iRow++) {
      ill_conditioning_matrix.index_.push_back(iRow);
      ill_conditioning_matrix.value_.push_back(1.0);
    }
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    ill_conditioning_matrix.num_row_ = incumbent_lp.num_row_;
    ill_conditioning_matrix.num_col_ = incumbent_lp.num_row_ + 1;
    ill_conditioning_matrix.ensureRowwise();
    ill_conditioning_matrix.format_ = MatrixFormat::kColwise;
  }
  // Now add the variables to measure the infeasibilities
  for (HighsInt iRow = 0; iRow < incumbent_lp.num_row_; iRow++) {
    // Adding x_+ with cost 1
    ill_conditioning_lp.col_cost_.push_back(1);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    ill_conditioning_matrix.index_.push_back(iRow);
    ill_conditioning_matrix.value_.push_back(1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
    // Subtracting x_- with cost 1
    ill_conditioning_lp.col_cost_.push_back(1);
    ill_conditioning_lp.col_lower_.push_back(0);
    ill_conditioning_lp.col_upper_.push_back(kHighsInf);
    ill_conditioning_matrix.index_.push_back(iRow);
    ill_conditioning_matrix.value_.push_back(-1.0);
    ill_conditioning_matrix.start_.push_back(
        HighsInt(ill_conditioning_matrix.index_.size()));
  }
  ill_conditioning_lp.num_col_ = 3 * incumbent_lp.num_row_;
  ill_conditioning_matrix.num_col_ = ill_conditioning_lp.num_col_;
  ill_conditioning_matrix.num_row_ = ill_conditioning_lp.num_row_;
}